

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type *this;
  unique_ptr<Net,_std::default_delete<Net>_> uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint x_00;
  int iVar5;
  int iVar6;
  Net *this_00;
  ostream *poVar7;
  Game *pGVar8;
  long lVar9;
  Game *pGVar10;
  invalid_argument *piVar11;
  Graphic graphic;
  dialogbox dialog;
  unique_ptr<Game,_std::default_delete<Game>_> game;
  unique_ptr<Net,_std::default_delete<Net>_> net;
  uint local_2e4;
  int y;
  int x;
  int local_2cc;
  invalid_argument *local_2c8;
  string input;
  string arg;
  string pass;
  string local_258;
  string local_238 [32];
  string local_218;
  string local_1f8;
  string ip;
  string sx;
  
  ip._M_dataplus._M_p = (pointer)&ip.field_2;
  ip._M_string_length = 0;
  ip.field_2._M_local_buf[0] = '\0';
  pass._M_dataplus._M_p = (pointer)&pass.field_2;
  pass._M_string_length = 0;
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  pass.field_2._M_local_buf[0] = '\0';
  game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.super__Head_base<0UL,_Game_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Game,_std::default_delete<Game>,_true,_true>)
                 (__uniq_ptr_impl<Game,_std::default_delete<Game>_>)0x0;
  arg.field_2._M_local_buf[0] = '\0';
  net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
  super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.super__Head_base<0UL,_Net_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Net,_std::default_delete<Net>,_true,_true>)
                 (__uniq_ptr_impl<Net,_std::default_delete<Net>_>)0x0;
  iVar3 = intGetOption(anon_var_dwarf_fe76);
  iVar6 = -1;
  if (iVar3 == 0) {
    iVar4 = intGetOption(anon_var_dwarf_fe99);
    if (iVar4 == 0) {
      pGVar8 = (Game *)operator_new(0x20);
      Game::Game(pGVar8);
      std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar8);
    }
    else {
      sx._M_dataplus._M_p = (pointer)&sx.field_2;
      sx._M_string_length = 0;
      sx.field_2._M_local_buf[0] = '\0';
      input._M_dataplus._M_p = (pointer)&input.field_2;
      input._M_string_length = 0;
      input.field_2._M_local_buf[0] = '\0';
      x_00 = intGetOption(anon_var_dwarf_feaf);
      pGVar8 = (Game *)(ulong)x_00;
      iVar4 = intGetOption(anon_var_dwarf_fec5);
      if ((8 < (int)x_00) || (8 < iVar4)) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pGVar10 = (Game *)operator_new(0x20);
      Game::Game(pGVar10,x_00,iVar4);
      std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar10);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::string::~string((string *)&sx);
    }
    bVar2 = true;
    goto LAB_00106da1;
  }
  if (iVar3 != 1) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"");
LAB_00107746:
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (Net *)operator_new(0x18);
  Net::Net(this_00);
  std::__uniq_ptr_impl<Net,_std::default_delete<Net>_>::reset
            ((__uniq_ptr_impl<Net,_std::default_delete<Net>_> *)&net,this_00);
  strGetOption_abi_cxx11_(&sx,anon_var_dwarf_fee5);
  std::__cxx11::string::operator=((string *)&ip,(string *)&sx);
  std::__cxx11::string::~string((string *)&sx);
  uVar1 = net;
  std::__cxx11::string::string((string *)&local_1f8,(string *)&ip);
  iVar4 = Net::makeconnect((Net *)uVar1._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>.
                                  _M_t.super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                                  super__Head_base<0UL,_Net_*,_false>._M_head_impl,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (iVar4 == 0) {
    iVar4 = intGetOption(anon_var_dwarf_ff11);
    if (iVar4 == 2) {
      pGVar8 = (Game *)Net::automatch((Net *)net._M_t.
                                             super___uniq_ptr_impl<Net,_std::default_delete<Net>_>.
                                             _M_t.
                                             super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>
                                             .super__Head_base<0UL,_Net_*,_false>._M_head_impl);
      if (pGVar8 == (Game *)0xffffffffffffffff) {
        bVar2 = false;
        iVar6 = 2;
        goto LAB_00106da1;
      }
      if (pGVar8 == (Game *)0x0) {
        pGVar8 = (Game *)operator_new(0x20);
        Game::Game(pGVar8);
        std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                  ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar8);
        Net::makeroom((Net *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                             super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                             super__Head_base<0UL,_Net_*,_false>._M_head_impl,
                      *(int *)(*(long *)game._M_t.
                                        super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t
                                        .super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                        super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x418) /
                      2,*(int *)(*(long *)game._M_t.
                                          super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                          .super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x41c
                                ) / 2);
        bVar2 = true;
        pGVar8 = (Game *)0x0;
        goto LAB_00106da1;
      }
      Net::login((Net *)&sx,
                 (longlong)
                 net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                 super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                 super__Head_base<0UL,_Net_*,_false>._M_head_impl);
      iVar6 = sx._M_dataplus._M_p._4_4_;
      if (sx._M_dataplus._M_p._4_4_ != -1) {
        iVar4 = (int)sx._M_dataplus._M_p;
        pGVar10 = (Game *)operator_new(0x20);
        Game::Game(pGVar10,iVar6,iVar4);
        goto LAB_001076fc;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fefb);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      if (iVar4 != 1) {
        if (iVar4 != 0) {
          piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar11,"");
          goto LAB_00107746;
        }
        iVar4 = intGetOption(anon_var_dwarf_fe99);
        if (iVar4 == 0) {
          pGVar8 = (Game *)operator_new(0x20);
          Game::Game(pGVar8);
          std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                    ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar8);
        }
        else {
          sx._M_dataplus._M_p = (pointer)&sx.field_2;
          sx._M_string_length = 0;
          sx.field_2._M_local_buf[0] = '\0';
          input._M_dataplus._M_p = (pointer)&input.field_2;
          input._M_string_length = 0;
          input.field_2._M_local_buf[0] = '\0';
          iVar4 = intGetOption(anon_var_dwarf_feaf);
          iVar5 = intGetOption(anon_var_dwarf_fec5);
          if ((8 < iVar4) || (8 < iVar5)) {
            piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar11,"");
            __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          pGVar8 = (Game *)operator_new(0x20);
          Game::Game(pGVar8,iVar4,iVar5);
          std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                    ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar8);
          std::__cxx11::string::~string((string *)&input);
          std::__cxx11::string::~string((string *)&sx);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ff27);
        poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
        std::operator<<(poVar7,anon_var_dwarf_ff3d);
        std::operator>>((istream *)&std::cin,(string *)&arg);
        iVar4 = std::__cxx11::string::compare((char *)&arg);
        if (iVar4 == 0) {
          strGetOption_abi_cxx11_(&sx,anon_var_dwarf_ff69);
          std::__cxx11::string::operator=((string *)&pass,(string *)&sx);
          std::__cxx11::string::~string((string *)&sx);
          uVar1 = net;
          iVar4 = *(int *)(*(long *)game._M_t.
                                    super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                                    super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                    super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x418);
          iVar5 = *(int *)(*(long *)game._M_t.
                                    super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                                    super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                    super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x41c);
          std::__cxx11::string::string((string *)&local_218,(string *)&pass);
          pGVar8 = (Game *)Net::makeroom((Net *)uVar1._M_t.
                                                super___uniq_ptr_impl<Net,_std::default_delete<Net>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>
                                                .super__Head_base<0UL,_Net_*,_false>._M_head_impl,
                                         iVar4 / 2,iVar5 / 2,&local_218);
          std::__cxx11::string::~string((string *)&local_218);
        }
        else {
          pGVar8 = (Game *)Net::makeroom((Net *)net._M_t.
                                                super___uniq_ptr_impl<Net,_std::default_delete<Net>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>
                                                .super__Head_base<0UL,_Net_*,_false>._M_head_impl,
                                         *(int *)(*(long *)game._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                                  .super__Head_base<0UL,_Game_*,_false>._M_head_impl
                                                 + 0x418) / 2,
                                         *(int *)(*(long *)game._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                                  .super__Head_base<0UL,_Game_*,_false>._M_head_impl
                                                 + 0x41c) / 2);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ff7f);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar7 = std::ostream::_M_insert<long_long>((longlong)poVar7);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
        bVar2 = true;
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_00106da1;
      }
      *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
           *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
           0xffffffb5 | 8;
      pGVar8 = (Game *)llGetOption(anon_var_dwarf_ff95);
      *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
           *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
           0xffffffb5 | 2;
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ffab);
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      std::operator<<(poVar7,anon_var_dwarf_ffc1);
      std::operator>>((istream *)&std::cin,(string *)&arg);
      iVar6 = std::__cxx11::string::compare((char *)&arg);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)&arg);
        if (iVar6 != 0) {
          piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar11,"");
          __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)&arg);
      if (iVar6 == 0) {
        strGetOption_abi_cxx11_(&sx,anon_var_dwarf_ff69);
        std::__cxx11::string::operator=((string *)&pass,(string *)&sx);
        std::__cxx11::string::~string((string *)&sx);
        uVar1 = net;
        std::__cxx11::string::string(local_238,(string *)&pass);
        Net::login((Net *)&sx,
                   (longlong)
                   uVar1._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                   super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                   super__Head_base<0UL,_Net_*,_false>._M_head_impl,(string *)pGVar8);
        iVar4 = (int)sx._M_dataplus._M_p;
        iVar6 = sx._M_dataplus._M_p._4_4_;
        std::__cxx11::string::~string(local_238);
      }
      else {
        Net::login((Net *)&sx,
                   (longlong)
                   net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                   super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                   super__Head_base<0UL,_Net_*,_false>._M_head_impl);
        iVar4 = (int)sx._M_dataplus._M_p;
        iVar6 = sx._M_dataplus._M_p._4_4_;
      }
      if (iVar6 != -1) {
        pGVar10 = (Game *)operator_new(0x20);
        Game::Game(pGVar10,iVar6,iVar4);
LAB_001076fc:
        std::__uniq_ptr_impl<Game,_std::default_delete<Game>_>::reset
                  ((__uniq_ptr_impl<Game,_std::default_delete<Game>_> *)&game,pGVar10);
        bVar2 = false;
        iVar6 = 1;
LAB_00106da1:
        Graphic::Graphic(&graphic);
        dialogbox::dialogbox(&dialog);
        Graphic::StartGame(&graphic);
        Graphic::Put(&graphic,*(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                **)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                   ._M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                   super__Head_base<0UL,_Game_*,_false>._M_head_impl);
        if (iVar3 == 1) {
          Graphic::netchangeturn
                    (&graphic,*(int *)((long)game._M_t.
                                             super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                             .super__Head_base<0UL,_Game_*,_false>._M_head_impl +
                                      0x18),iVar6);
          if (bVar2) {
            std::__cxx11::to_string(&local_258,(longlong)pGVar8);
            Graphic::netwait(&graphic,&local_258);
            std::__cxx11::string::~string((string *)&local_258);
          }
        }
        else {
          Graphic::changeturn(&graphic,*(int *)((long)game._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                                  .super__Head_base<0UL,_Game_*,_false>._M_head_impl
                                               + 0x18));
        }
        input._M_dataplus._M_p = (pointer)&input.field_2;
        input._M_string_length = 0;
        input.field_2._M_local_buf[0] = '\0';
        this = &sx._M_string_length;
        local_2e4 = 0;
        local_2cc = iVar3;
LAB_00106e61:
        if (iVar3 == 1) {
          while( true ) {
            if ((*(int *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                         super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                         super__Head_base<0UL,_Net_*,_false>._M_head_impl != 0) ||
               ((iVar6 == *(int *)((long)game._M_t.
                                         super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                         super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x18)
                && (*(int *)((long)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>.
                                   _M_t.super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                                   super__Head_base<0UL,_Net_*,_false>._M_head_impl + 4) != 0))))
            goto LAB_00106fbc;
            Net::get_abi_cxx11_((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                 *)&sx,(Net *)net._M_t.
                                              super___uniq_ptr_impl<Net,_std::default_delete<Net>_>.
                                              _M_t.
                                              super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>
                                              .super__Head_base<0UL,_Net_*,_false>._M_head_impl);
            lVar9 = std::__cxx11::string::find((char *)this,0x10a5b4);
            if (lVar9 != -1) break;
            lVar9 = std::__cxx11::string::find((char *)this,0x10a5bb);
            if (lVar9 != -1) break;
            lVar9 = std::__cxx11::string::find((char *)this,0x10a5c1);
            if ((lVar9 != -1) &&
               (iVar6 != *(int *)((long)game._M_t.
                                        super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t
                                        .super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                        super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x18)))
            {
              Game::put((Game *)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl,
                        sx._M_dataplus._M_p._4_4_,(int)sx._M_dataplus._M_p,local_2e4);
LAB_00106f92:
              Graphic::Put(&graphic,*(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      **)game._M_t.
                                         super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                         super__Head_base<0UL,_Game_*,_false>._M_head_impl);
              Graphic::netchangeturn
                        (&graphic,*(int *)((long)game._M_t.
                                                 super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                                 .super__Head_base<0UL,_Game_*,_false>._M_head_impl
                                          + 0x18),iVar6);
              goto LAB_00106fb4;
            }
            lVar9 = std::__cxx11::string::find((char *)this,0x10a5c5);
            if ((lVar9 != -1) &&
               (iVar6 != *(int *)((long)game._M_t.
                                        super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t
                                        .super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                        super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x18)))
            {
              Game::put((Game *)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl,
                        sx._M_dataplus._M_p._4_4_,(int)sx._M_dataplus._M_p);
              goto LAB_00106f92;
            }
            lVar9 = std::__cxx11::string::find((char *)this,0x10a5c9);
            if (lVar9 == -1) goto LAB_00106fb4;
            Graphic::netchangeturn
                      (&graphic,*(int *)((long)game._M_t.
                                               super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                               .super__Head_base<0UL,_Game_*,_false>._M_head_impl +
                                        0x18),iVar6);
            *(undefined8 *)
             ((long)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                    super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                    super__Head_base<0UL,_Net_*,_false>._M_head_impl + 4) = 0x100000001;
            std::__cxx11::string::~string((string *)this);
          }
          *(undefined4 *)
           net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
           super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
           super__Head_base<0UL,_Net_*,_false>._M_head_impl = 1;
LAB_00106fb4:
          std::__cxx11::string::~string((string *)this);
        }
LAB_00106fbc:
        do {
          if ((iVar3 != 0) &&
             (*(int *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                      super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                      super__Head_base<0UL,_Net_*,_false>._M_head_impl != 0)) goto LAB_00107120;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&input);
          iVar4 = std::__cxx11::string::compare((char *)&input);
          if (iVar4 != 0) goto code_r0x00106ff4;
          local_2e4 = (uint)(local_2e4 == 0);
          std::operator<<((ostream *)&std::cout,"\x1b[2;42H\x1b[0K");
          iVar3 = local_2cc;
        } while( true );
      }
      poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fefb);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_fefb);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  iVar6 = 1;
  goto LAB_0010728a;
code_r0x00106ff4:
  iVar4 = std::__cxx11::string::compare((char *)&input);
  if (iVar4 == 0) {
    Net::closing((Net *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                        super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                        super__Head_base<0UL,_Net_*,_false>._M_head_impl);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&sx,(string *)&input,_S_out|_S_in);
    iVar4 = __isoc99_sscanf(input._M_dataplus._M_p,"%x %x",&x,&y);
    if (((iVar4 < 2) || (0xf < x)) || (0xf < y)) {
      local_2c8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(local_2c8,"");
      __cxa_throw(local_2c8,&std::invalid_argument::typeinfo,
                  std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&sx);
  }
  if (iVar3 == 0) {
LAB_0010713d:
    if (local_2e4 == 0) {
      bVar2 = Game::put((Game *)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl,x,y);
      if (!bVar2) goto LAB_001071cf;
      if (iVar3 == 1) {
        Net::put((Net *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                        super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                        super__Head_base<0UL,_Net_*,_false>._M_head_impl,x,y);
      }
      Graphic::Put(&graphic,*(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              **)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                 _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                 super__Head_base<0UL,_Game_*,_false>._M_head_impl);
LAB_001071b6:
      if (iVar3 == 1) {
        Graphic::netchangeturn
                  (&graphic,*(int *)((long)game._M_t.
                                           super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                           .super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x18
                                    ),iVar6);
      }
      else {
        Graphic::changeturn(&graphic,*(int *)((long)game._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>
                                                  .super__Head_base<0UL,_Game_*,_false>._M_head_impl
                                             + 0x18));
      }
    }
    else {
      bVar2 = Game::put((Game *)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl,x,y,1);
      if (bVar2) {
        if (iVar3 == 1) {
          Net::freeput((Net *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                              super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                              super__Head_base<0UL,_Net_*,_false>._M_head_impl,x,y);
        }
        Graphic::Put(&graphic,*(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                **)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>
                                   ._M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                   super__Head_base<0UL,_Game_*,_false>._M_head_impl);
        goto LAB_001071b6;
      }
LAB_001071cf:
      std::operator<<((ostream *)&std::cout,"\x1b[2;42H\x1b[0K");
    }
    if (*(char *)((long)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
                        super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                        super__Head_base<0UL,_Game_*,_false>._M_head_impl + 8) == '\x01') {
      dialogbox::EndGameDialogBox
                (&dialog,*(int *)((long)game._M_t.
                                        super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t
                                        .super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                        super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x10),
                 *(int *)((long)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x14),
                 *(int *)((long)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0xc));
      Graphic::end(&graphic);
      *(undefined1 *)
       ((long)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>._M_t.
              super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
              super__Head_base<0UL,_Game_*,_false>._M_head_impl + 8) = 0;
    }
  }
  else {
LAB_00107120:
    if ((iVar6 == *(int *)((long)game._M_t.super___uniq_ptr_impl<Game,_std::default_delete<Game>_>.
                                 _M_t.super__Tuple_impl<0UL,_Game_*,_std::default_delete<Game>_>.
                                 super__Head_base<0UL,_Game_*,_false>._M_head_impl + 0x18)) &&
       (*(int *)((long)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                       super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                       super__Head_base<0UL,_Net_*,_false>._M_head_impl + 4) != 0))
    goto LAB_0010713d;
  }
  if (((iVar3 != 1) ||
      (*(int *)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
               super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
               super__Head_base<0UL,_Net_*,_false>._M_head_impl != 1)) ||
     (*(int *)((long)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
                     super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
                     super__Head_base<0UL,_Net_*,_false>._M_head_impl + 4) != 1)) goto LAB_00106e61;
  dialogbox::ConnectionclosedDialogBox(&dialog);
  Graphic::end(&graphic);
  *(undefined4 *)
   ((long)net._M_t.super___uniq_ptr_impl<Net,_std::default_delete<Net>_>._M_t.
          super__Tuple_impl<0UL,_Net_*,_std::default_delete<Net>_>.
          super__Head_base<0UL,_Net_*,_false>._M_head_impl + 4) = 0;
  std::__cxx11::string::~string((string *)&input);
  dialogbox::~dialogbox(&dialog);
  Graphic::~Graphic(&graphic);
  iVar6 = 0;
LAB_0010728a:
  std::unique_ptr<Net,_std::default_delete<Net>_>::~unique_ptr(&net);
  std::unique_ptr<Game,_std::default_delete<Game>_>::~unique_ptr(&game);
  std::__cxx11::string::~string((string *)&arg);
  std::__cxx11::string::~string((string *)&pass);
  std::__cxx11::string::~string((string *)&ip);
  return iVar6;
}

Assistant:

int main(int argc, char *argv[]){
	std::string ip, pass, arg;
	long long room;
	int x, y, mode = -1, netmode = -1, netret, freeput = 0;
	std::unique_ptr<Game> game;
	std::unique_ptr<Net> net;
	try{
		mode=intGetOption("モードを選択してください\n0:オフラインで交互にプレイする 1:オンラインでプレイする場合 :");
		if(mode==0){//offline
			if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0) game.reset(new Game());
			else{
				std::string sx,sy;
				int x,y;
				x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				if(x>8||y>8)throw std::invalid_argument("");
				game.reset(new Game(x,y));
			}
		} else if(mode==1){//online
			net.reset(new Net());
			ip=strGetOption("サーバーのIPアドレスまたはドメインを入力してください:");
			netret=net->makeconnect(ip);
			if(netret){
				std::cout<<"通信エラー:終了します"<<std::endl;
				return 1;
			}
			netmode=intGetOption("モードを選択してください\n0:ホストとして部屋を立てる 1:ゲストとして部屋に入る 2:オートマッチング :");
			if(netmode==0){//host
				netmode=-1;
				if(netret==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0){
					game.reset(new Game());
				} else{
					std::string sx,sy;
					int x,y;
					x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					if(x>8||y>8)throw std::invalid_argument("");
					game.reset(new Game(x,y));
				}
				std::cout<<"パスワードを設定しますか?"<<std::endl<<"0:設定しない 1:設定する :";
				std::cin>>arg;
				if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					room=net->makeroom(game->board->boardx/2,game->board->boardy/2,pass);
				} else 	room=net->makeroom(game->board->boardx/2,game->board->boardy/2);
				std::cout<<"部屋番号:"<<std::hex<<room<<std::dec<<std::endl;
			} else if(netmode==1){//guest
				netmode=1;
				std::tuple<int,int> size;
				std::cin.setf(std::ios::hex,std::ios::basefield);
				room=llGetOption("部屋番号を入力してください:");
				std::cin.setf(std::ios::dec,std::ios::basefield);
				std::cout<<"パスワードが設定されていますか?"<<std::endl<<"0:設定されていない 1:設定されている :";
				std::cin>>arg;
				if(arg.compare("0")&&arg.compare("1"))throw std::invalid_argument("");
				else if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					size=net->login(room,pass);
				} else{
					size=net->login(room);
				}
				if(std::get<0>(size)==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				game.reset(new Game(std::get<0>(size),std::get<1>(size)));
			} else if(netmode==2){//automatch
				room=net->automatch();
				if(room==0){
					netmode=-1;
					game.reset(new Game());
					net->makeroom(game->board->boardx/2,game->board->boardy/2);
				} else if(room!=-1){
					netmode=1;
					std::tuple<int,int> size;
					size=net->login(room);
					if(std::get<0>(size)==-1){
						std::cout<<"通信エラー:終了します"<<std::endl;
						return 1;
					}
					game.reset(new Game(std::get<0>(size),std::get<1>(size)));
				}
			} else throw std::invalid_argument("");
		} else  throw std::invalid_argument("");
	} catch(const std::invalid_argument &e){
		std::cout<<"入力が不正です:終了します";
		return 1;
	}
	Graphic graphic;
	dialogbox dialog;

	graphic.StartGame();
	graphic.Put(game->board->delta);
	if(mode==1){
		graphic.netchangeturn(game->turn,netmode);
		if(netmode==-1)graphic.netwait(std::to_string(room));
	}else graphic.changeturn(game->turn);
	std::string input;
	while(true){
		if(mode==1&&net->closed == 0&&(netmode!=game->turn||!net->ready)){
			std::tuple<std::string, int, int> action = net->get();
			if(std::get<0>(action).find("nodata")!=std::string::npos || std::get<0>(action).find("CLOSE")!=std::string::npos){
				net->closed = 1;
			} else if(std::get<0>(action).find("FREEPUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action), freeput);
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("PUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action));
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("READY")!=std::string::npos){
				graphic.netchangeturn(game->turn,netmode);
				net->started = 1;
				net->ready = 1;
				continue;
			}
		}
		while(mode==0||net->closed==0){
			std::getline(std::cin,input);
			if(!input.compare("free")){
				freeput=!freeput;
				std::cout<<"\e[2;42H\e[0K";
				continue;
			}else if(!input.compare("end")){
				net->closing();
				break;
			}
			try{
				std::stringstream stream(input);
				if(sscanf(input.c_str(),"%x %x",&x,&y)<2||x>15||y>15)throw std::invalid_argument("");
				break;
			}catch(const std::invalid_argument& e){
				std::cout<<"\e[2;42H\e[0K";
			}
		}
		if(mode == 0 || (netmode == game->turn&&net->ready)){
			if(freeput == 0){
				if(game->put(x, y)){
					if(mode == 1)net->put(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			} else {
				if(game->put(x, y, freeput)){
					if(mode == 1)net->freeput(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			}
			if(game->full){
				dialog.EndGameDialogBox(game->b, game->w, game->howturn);
				graphic.end();
				game->full = false;
			}
		}
			if(mode == 1 && net->closed == 1 && net->ready == 1){
				dialog.ConnectionclosedDialogBox();
				graphic.end();
				net->ready=0;
				break;
			}
	}
	return 0;
}